

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_list.h
# Opt level: O0

void mk_list_add_after(mk_list *_new,mk_list *prev,mk_list *head)

{
  mk_list *pmVar1;
  mk_list *next;
  mk_list *head_local;
  mk_list *prev_local;
  mk_list *_new_local;
  
  if ((head->prev == head->next) || (head->prev == prev)) {
    mk_list_add(_new,head);
  }
  else {
    pmVar1 = prev->next;
    _new->next = pmVar1;
    _new->prev = prev;
    prev->next = _new;
    pmVar1->prev = _new;
  }
  return;
}

Assistant:

static inline void mk_list_add_after(struct mk_list *_new,
                                     struct mk_list *prev,
                                     struct mk_list *head)
{
    struct mk_list *next;

    if (head->prev == head->next || head->prev == prev) {
        mk_list_add(_new, head);
        return;
    }

    next = prev->next;
    _new->next = next;
    _new->prev = prev;
    prev->next = _new;
    next->prev = _new;
}